

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::CreateSMBusTransaction(SMBusSimulationDataGenerator *this)

{
  SMBusSimulationDataGenerator *this_local;
  
  OutputQuickCommand(this);
  OutputSendByte(this,'\x01');
  OutputRecvByte(this,'\x02');
  if (this->mSettings->mDecodeLevel == DL_PMBus) {
    OutputProcessCallPMBusCoefficients(this);
    OutputReadByte(this,'\x19',0xb0);
    OutputBlockProcessCallPMBusQuery(this);
    OutputWriteByte(this,'\x10',' ');
    OutputReadByte(this,'\x10','\0');
    OutputWriteByte(this,'\x01',' ');
    OutputReadByte(this,'\x01','\0');
    OutputWriteByte(this,'\x02',0xff);
    OutputReadByte(this,'\x02',0xff);
    OutputWriteByte(this,' ',0xff);
    OutputReadByte(this,' ',0xff);
    OutputPMBusGroupCommand(this);
  }
  else if (this->mSettings->mDecodeLevel == DL_SmartBattery) {
    OutputWriteWord(this,'\0',0x1234);
    OutputReadWord(this,'\0',0x5678);
    OutputWriteWord(this,'\x03',0xabcd);
    OutputReadWord(this,'\x16',0xabcd);
    OutputReadWord(this,'\x1a',0xabcd);
    OutputReadWord(this,'\x1b',0x1234);
  }
  else {
    OutputQuickCommand(this);
    OutputSendByte(this,0xae);
    OutputRecvByte(this,'f');
    OutputWriteByte(this,0x83,'s');
    OutputReadByte(this,0x84,0x91);
    OutputWriteWord(this,'\x12',0x92);
    OutputReadWord(this,'\x05',0x62);
  }
  return;
}

Assistant:

void SMBusSimulationDataGenerator::CreateSMBusTransaction()
{
    OutputQuickCommand();
    OutputSendByte( 0x01 );
    OutputRecvByte( 0x02 );

    if( mSettings->mDecodeLevel == DL_PMBus )
    {
        OutputProcessCallPMBusCoefficients();
        OutputReadByte( CAPABILITY, 0xB0 );
        OutputBlockProcessCallPMBusQuery();

        OutputWriteByte( WRITE_PROTECT, 0x20 );
        OutputReadByte( WRITE_PROTECT, 0x00 );

        OutputWriteByte( OPERATION, 0x20 );
        OutputReadByte( OPERATION, 0x00 );

        OutputWriteByte( ON_OFF_CONFIG, 0xff );
        OutputReadByte( ON_OFF_CONFIG, 0xff );

        OutputWriteByte( VOUT_MODE, 0xff );
        OutputReadByte( VOUT_MODE, 0xff );

        OutputPMBusGroupCommand();
    }
    else if( mSettings->mDecodeLevel == DL_SmartBattery )
    {
        OutputWriteWord( SBC_ManufacturerAccess, 0x1234 );
        OutputReadWord( SBC_ManufacturerAccess, 0x5678 );

        OutputWriteWord( SBC_BatteryMode, 0xabcd );
        OutputReadWord( SBC_BatteryStatus, 0xabcd );

        OutputReadWord( SBC_SpecificationInfo, 0xabcd );
        OutputReadWord( SBC_ManufactureDate, 0x1234 );
    }
    else
    {
        OutputQuickCommand();
        OutputSendByte( 0xae );
        OutputRecvByte( 0x66 );
        OutputWriteByte( 0x83, 0x73 );
        OutputReadByte( 0x84, 0x91 );
        OutputWriteWord( 0x12, 0x92 );
        OutputReadWord( 0x05, 0x62 );
    }
}